

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O2

void __thiscall InsertProxyModelPrivate::afterSort(InsertProxyModelPrivate *this,bool isRow)

{
  InsertProxyModel *pIVar1;
  QMap<int,_QVariant> *pQVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  reference this_00;
  long lVar7;
  uint uVar8;
  undefined7 in_register_00000031;
  ulong uVar9;
  ulong uVar10;
  undefined4 local_cc;
  QList<QMap<int,_QVariant>_> oldlayout;
  QModelIndexList toList;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  QModelIndex local_48;
  
  pIVar1 = this->q_ptr;
  plVar6 = (long *)QAbstractProxyModel::sourceModel();
  if ((int)CONCAT71(in_register_00000031,isRow) == 0) {
    uVar8 = 1;
    lVar7 = 0x80;
  }
  else {
    uVar8 = 2;
    lVar7 = 0x78;
  }
  oldlayout.d.d = (Data *)0xffffffffffffffff;
  oldlayout.d.ptr = (QMap<int,_QVariant> *)0x0;
  oldlayout.d.size = 0;
  uVar4 = (**(code **)(*plVar6 + lVar7))(plVar6);
  if (((this->m_insertDirection).i & uVar8) != 0) {
    bVar3 = !isRow;
    oldlayout.d.d = this->m_extraData[bVar3].d.d;
    oldlayout.d.ptr = this->m_extraData[bVar3].d.ptr;
    oldlayout.d.size = this->m_extraData[bVar3].d.size;
    if (oldlayout.d.d != (Data *)0x0) {
      LOCK();
      ((oldlayout.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((oldlayout.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (isRow) {
      plVar6 = (long *)QAbstractProxyModel::sourceModel();
      toList.d.d = (Data *)0xffffffffffffffff;
      toList.d.ptr = (QModelIndex *)0x0;
      toList.d.size = 0;
      local_cc = (**(code **)(*plVar6 + 0x80))(plVar6);
    }
    else {
      plVar6 = (long *)QAbstractProxyModel::sourceModel();
      local_48.r = -1;
      local_48.c = -1;
      local_48.i = 0;
      local_48.m = (QAbstractItemModel *)0x0;
      local_cc = (**(code **)(*plVar6 + 0x78))(plVar6);
    }
    toList.d.d = (Data *)0x0;
    toList.d.ptr = (QModelIndex *)0x0;
    toList.d.size = 0;
    QList<QModelIndex>::reserve(&toList,(long)(int)uVar4);
    uVar9 = 0;
    uVar10 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar10 = uVar9;
    }
    for (; uVar10 << 3 != uVar9; uVar9 = uVar9 + 8) {
      if (isRow) {
        iVar5 = QPersistentModelIndex::row();
      }
      else {
        iVar5 = QPersistentModelIndex::column();
      }
      pQVar2 = oldlayout.d.ptr;
      this_00 = QList<QMap<int,_QVariant>_>::operator[](this->m_extraData + bVar3,(long)iVar5);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
      ::operator=(&this_00->d,
                  (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                   *)((long)&(pQVar2->d).d + uVar9));
      if (isRow) {
        local_60 = 0xffffffffffffffff;
        local_58 = 0;
        uStack_50 = 0;
        (**(code **)(*(long *)pIVar1 + 0x60))(&local_48,pIVar1,iVar5,local_cc,&local_60);
      }
      else {
        local_78 = 0xffffffffffffffff;
        local_70 = 0;
        uStack_68 = 0;
        (**(code **)(*(long *)pIVar1 + 0x60))(&local_48,pIVar1,local_cc,iVar5,&local_78);
      }
      QList<QModelIndex>::emplaceBack<QModelIndex>(&toList,&local_48);
    }
    QAbstractItemModel::changePersistentIndexList
              ((QList_conflict *)pIVar1,(QList_conflict *)&this->m_layoutChangeExtraProxyIndexes);
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&toList.d);
    QArrayDataPointer<QMap<int,_QVariant>_>::~QArrayDataPointer(&oldlayout.d);
  }
  QList<QModelIndex>::clear(&this->m_layoutChangeExtraProxyIndexes);
  QList<QPersistentModelIndex>::clear(&this->m_layoutChangeExtraPersistentIndexes);
  return;
}

Assistant:

void InsertProxyModelPrivate::afterSort(bool isRow)
{
    Q_Q(InsertProxyModel);
    const int maxSortedIdx = isRow ? q->sourceModel()->rowCount() : q->sourceModel()->columnCount();
    const InsertProxyModel::InsertDirections directionCheck = isRow ? InsertProxyModel::InsertColumn : InsertProxyModel::InsertRow;
    if (m_insertDirection & directionCheck) {
        const auto oldlayout = m_extraData[!isRow];
        const int maxSecondaryIdx = isRow ? q->sourceModel()->columnCount() : q->sourceModel()->rowCount();
        QModelIndexList toList;
        toList.reserve(maxSortedIdx);
        Q_ASSERT(m_layoutChangeExtraPersistentIndexes.size() == maxSortedIdx);
        for (int i = 0; i < maxSortedIdx; ++i) {
            const int newSortedIdx = isRow ? m_layoutChangeExtraPersistentIndexes.at(i).row() : m_layoutChangeExtraPersistentIndexes.at(i).column();
            m_extraData[!isRow][newSortedIdx] = oldlayout.at(i);
            toList << (isRow ? q->index(newSortedIdx, maxSecondaryIdx) : q->index(maxSecondaryIdx, newSortedIdx));
        }
        q->changePersistentIndexList(m_layoutChangeExtraProxyIndexes, toList);
    }
    m_layoutChangeExtraProxyIndexes.clear();
    m_layoutChangeExtraPersistentIndexes.clear();
}